

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  ImDrawCallback p_Var5;
  undefined1 auVar6 [16];
  float fb_width;
  float fb_height;
  GLboolean GVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  undefined4 in_EAX;
  int iVar11;
  uint uVar12;
  ImDrawCmd *pIVar13;
  PFNGLENABLEPROC *pp_Var14;
  long lVar15;
  int cmd_i;
  PFNGLENABLEPROC *pp_Var16;
  float fVar17;
  float fVar19;
  undefined1 auVar18 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  GLuint vertex_array_object;
  GLenum local_10c;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLenum last_clip_origin;
  GLint last_polygon_mode [2];
  float local_78;
  float local_68;
  
  local_c8 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fStack_c4 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar18._0_4_ = -(uint)(0 < (int)local_c8);
  auVar18._4_4_ = -(uint)(0 < (int)local_c8);
  auVar18._8_4_ = -(uint)(0 < (int)fStack_c4);
  auVar18._12_4_ = -(uint)(0 < (int)fStack_c4);
  iVar11 = movmskpd(in_EAX,auVar18);
  if (iVar11 == 3) {
    uStack_c0 = 0;
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&last_active_texture);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,&last_program);
    (*glad_glGetIntegerv)(0x8069,&last_texture);
    (*glad_glGetIntegerv)(0x8919,&last_sampler);
    (*glad_glGetIntegerv)(0x8894,&last_array_buffer);
    (*glad_glGetIntegerv)(0x85b5,&last_vertex_array_object);
    (*glad_glGetIntegerv)(0xb40,last_polygon_mode);
    (*glad_glGetIntegerv)(0xba2,last_viewport);
    (*glad_glGetIntegerv)(0xc10,last_scissor_box);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&last_blend_src_rgb);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_rgb);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&last_blend_src_alpha);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&last_blend_dst_alpha);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&last_blend_equation_rgb);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&last_blend_equation_alpha);
    GVar7 = (*glad_glIsEnabled)(0xbe2);
    GVar8 = (*glad_glIsEnabled)(0xb44);
    GVar9 = (*glad_glIsEnabled)(0xb71);
    GVar10 = (*glad_glIsEnabled)(0xc11);
    last_clip_origin = 0;
    (*glad_glGetIntegerv)(0x935c,(GLint *)&last_clip_origin);
    local_10c = last_clip_origin;
    vertex_array_object = 0;
    (*glad_glGenVertexArrays)(1,&vertex_array_object);
    fb_height = fStack_c4;
    fb_width = local_c8;
    local_d8 = fStack_c4;
    fStack_d4 = fStack_c4;
    fStack_d0 = fStack_c4;
    fStack_cc = fStack_c4;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_c8,(int)fStack_c4,vertex_array_object);
    IVar2 = draw_data->DisplayPos;
    IVar3 = draw_data->FramebufferScale;
    fVar21 = IVar3.y;
    fVar19 = IVar2.y;
    _local_c8 = CONCAT44((float)(int)fStack_c4,(float)(int)local_c8);
    uStack_c0 = CONCAT44((float)uStack_c0._4_4_,(float)(int)uStack_c0);
    local_d8 = (float)(int)local_d8;
    fStack_d4 = (float)(int)fStack_d4;
    fStack_d0 = (float)(int)fStack_d0;
    fStack_cc = (float)(int)fStack_cc;
    for (lVar15 = 0; lVar15 < draw_data->CmdListsCount; lVar15 = lVar15 + 1) {
      this = draw_data->CmdLists[lVar15];
      (*glad_glBufferData)(0x8892,(long)(this->VtxBuffer).Size * 0x14,(this->VtxBuffer).Data,0x88e0)
      ;
      (*glad_glBufferData)(0x8893,(long)(this->IdxBuffer).Size * 2,(this->IdxBuffer).Data,0x88e0);
      for (iVar11 = 0; iVar11 < (this->CmdBuffer).Size; iVar11 = iVar11 + 1) {
        pIVar13 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar11);
        p_Var5 = pIVar13->UserCallback;
        if (p_Var5 == (ImDrawCallback)0x0) {
          local_68 = IVar2.x;
          local_78 = IVar3.x;
          fVar17 = ((pIVar13->ClipRect).x - local_68) * local_78;
          if ((fVar17 < local_c8) &&
             (fVar20 = ((pIVar13->ClipRect).y - fVar19) * fVar21, fVar20 < local_d8)) {
            uVar1 = (pIVar13->ClipRect).z;
            uVar4 = (pIVar13->ClipRect).w;
            local_78 = ((float)uVar1 - local_68) * local_78;
            fVar22 = ((float)uVar4 - fVar19) * fVar21;
            auVar6._4_4_ = -(uint)(0.0 <= local_78);
            auVar6._0_4_ = -(uint)(0.0 <= local_78);
            auVar6._8_4_ = -(uint)(0.0 <= fVar22);
            auVar6._12_4_ = -(uint)(0.0 <= fVar22);
            uVar12 = movmskpd(0,auVar6);
            if (((uVar12 & 1) != 0) && ((byte)((byte)uVar12 >> 1) != 0)) {
              if (local_10c != 0x8ca2) {
                fVar23 = local_d8 - fVar22;
                local_78 = local_78 - fVar17;
                fVar22 = fVar22 - fVar20;
                fVar20 = fVar23;
              }
              (*glad_glScissor)((int)fVar17,(int)fVar20,(int)local_78,(int)fVar22);
              (*glad_glBindTexture)(0xde1,*(GLuint *)&pIVar13->TextureId);
              (*glad_glDrawElements)
                        (4,pIVar13->ElemCount,0x1403,(void *)((ulong)pIVar13->IdxOffset * 2));
            }
          }
        }
        else if (p_Var5 == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL3_SetupRenderState
                    (draw_data,(int)fb_width,(int)fb_height,vertex_array_object);
        }
        else {
          (*p_Var5)(this,pIVar13);
        }
      }
    }
    (*glad_glDeleteVertexArrays)(1,&vertex_array_object);
    (*glad_glUseProgram)(last_program);
    (*glad_glBindTexture)(0xde1,last_texture);
    (*glad_glBindSampler)(0,last_sampler);
    (*glad_glActiveTexture)(last_active_texture);
    (*glad_glBindVertexArray)(last_vertex_array_object);
    (*glad_glBindBuffer)(0x8892,last_array_buffer);
    (*glad_glBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*glad_glBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    pp_Var16 = &glad_glEnable;
    pp_Var14 = &glad_glEnable;
    if (GVar7 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xbe2);
    pp_Var14 = &glad_glEnable;
    if (GVar8 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb44);
    pp_Var14 = &glad_glEnable;
    if (GVar9 == '\0') {
      pp_Var14 = &glad_glDisable;
    }
    (**pp_Var14)(0xb71);
    if (GVar10 == '\0') {
      pp_Var16 = &glad_glDisable;
    }
    (**pp_Var16)(0xc11);
    (*glad_glPolygonMode)(0x408,last_polygon_mode[0]);
    (*glad_glViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*glad_glScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],
                      last_scissor_box[3]);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_HAS_DRAW_WITH_BASE_VERTEX
                    glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
#else
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
#endif
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}